

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_> __thiscall
Parser::parseFunctionDeclaration(Parser *this)

{
  TypeName TVar1;
  Mark *pMVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer this_00;
  allocator<char> *in_RSI;
  __uniq_ptr_data<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>,_true,_true>
  in_RDI;
  Parser *in_stack_00000008;
  unique_ptr<BlockNode,_std::default_delete<BlockNode>_> body;
  TypeName type;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  Mark mark;
  __single_object *node;
  Parser *in_stack_00000188;
  undefined4 in_stack_fffffffffffffea0;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  allocator<char> local_109;
  string *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  TokenType in_stack_ffffffffffffff04;
  Parser *in_stack_ffffffffffffff08;
  TypeName *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  TokenType in_stack_ffffffffffffff2c;
  Parser *in_stack_ffffffffffffff30;
  string local_c8 [40];
  Parser *in_stack_ffffffffffffff60;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  Mark local_18 [3];
  
  pMVar2 = Tokenizer::getMark((Tokenizer *)0x19b286);
  local_18[0] = *pMVar2;
  __s = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),(char *)__s,in_RSI);
  expectToken(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),(char *)__s,in_RSI);
  getToken(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8);
  pbVar3 = std::get<std::__cxx11::string,std::__cxx11::string,double>
                     ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)0x19b349);
  std::__cxx11::string::string(local_70,(string *)pbVar3);
  Token::~Token((Token *)0x19b36f);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  parseArgumentList_abi_cxx11_(in_stack_00000008);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),(char *)__s,in_RSI);
  expectToken(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  std::allocator<char>::~allocator(&local_109);
  TVar1 = parseType(in_stack_ffffffffffffff60);
  parseBlock(in_stack_00000188);
  std::
  make_unique<FunctionDeclarationNode,std::__cxx11::string_const&,TypeName_const&,std::__cxx11::list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>const&,std::unique_ptr<BlockNode,std::default_delete<BlockNode>>>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
              *)in_stack_ffffffffffffff08,
             (unique_ptr<BlockNode,_std::default_delete<BlockNode>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  this_00 = std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>
            ::operator->((unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>
                          *)0x19b44c);
  Node::setMark((Node *)this_00,local_18);
  std::unique_ptr<BlockNode,_std::default_delete<BlockNode>_>::~unique_ptr
            ((unique_ptr<BlockNode,_std::default_delete<BlockNode>_> *)
             CONCAT44(TVar1,in_stack_fffffffffffffea0));
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::~list((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
           *)0x19b5f1);
  std::__cxx11::string::~string(local_70);
  return (__uniq_ptr_data<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>,_true,_true>
          )(tuple<FunctionDeclarationNode_*,_std::default_delete<FunctionDeclarationNode>_>)
           in_RDI.
           super___uniq_ptr_impl<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_FunctionDeclarationNode_*,_std::default_delete<FunctionDeclarationNode>_>
           .super__Head_base<0UL,_FunctionDeclarationNode_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FunctionDeclarationNode> Parser::parseFunctionDeclaration()
{
  const auto mark = tokenizer_.getMark();
  expectToken(TokenType::KeywordFn, "Expected function declaration!");
  const auto name = std::get<std::string>(getToken(TokenType::Identifier, "Expected function name!").value);
  const auto args = parseArgumentList();

  expectToken(TokenType::Colon, "Expected colon!");
  const auto type = parseType();

  auto body = parseBlock();
  auto node = std::make_unique<FunctionDeclarationNode>(name, type, args, std::move(body));
  node->setMark(mark);
  return node;
}